

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

bool __thiscall
GF2::MP<137UL,_GF2::MOGrlex<137UL>_>::Geobucket<4UL>::PopLM(Geobucket<4UL> *this,MM<137UL> *lm)

{
  size_t *psVar1;
  pointer pMVar2;
  pointer pMVar3;
  long lVar4;
  void *pvVar5;
  int iVar6;
  size_t pos;
  long lVar7;
  long lVar8;
  long lVar9;
  
  pMVar2 = (this->_buckets).
           super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->_buckets).
                super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar2 >> 5;
  lVar9 = -1;
  do {
    lVar8 = lVar8 + -1;
    pMVar3 = (this->_buckets).
             super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(size_t *)
         ((long)&pMVar3[lVar8].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                 super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> + 0x10) != 0) {
      if (lVar9 != -1) {
        iVar6 = MOGrlex<137UL>::Compare
                          ((MOGrlex<137UL> *)&pMVar2->field_0x18,
                           (MM<137UL> *)
                           (*(long *)&pMVar3[lVar8].
                                      super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                                      super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>
                           + 0x10),lm);
        if (iVar6 < 1) {
          if (iVar6 == 0) {
            pMVar3 = (this->_buckets).
                     super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar5 = *(void **)&pMVar3[lVar9].
                                super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                                super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
            psVar1 = (size_t *)
                     ((long)&pMVar3[lVar9].
                             super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                             super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> +
                     0x10);
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(pvVar5,0x28);
            pMVar3 = (this->_buckets).
                     super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar5 = *(void **)&pMVar3[lVar8].
                                super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                                super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
            psVar1 = (size_t *)
                     ((long)&pMVar3[lVar8].
                             super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                             super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> +
                     0x10);
            *psVar1 = *psVar1 - 1;
            std::__detail::_List_node_base::_M_unhook();
            operator_delete(pvVar5,0x28);
            lVar8 = (long)(this->_buckets).
                          super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_buckets).
                          super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5;
            lVar9 = -1;
          }
          goto LAB_001334d0;
        }
      }
      lVar4 = *(long *)&(this->_buckets).
                        super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar8].
                        super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                        super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
      lVar7 = 0;
      do {
        (lm->super_WW<137UL>)._words[lVar7] = *(word *)(lVar4 + 0x10 + lVar7 * 8);
        lVar7 = lVar7 + 1;
        lVar9 = lVar8;
      } while (lVar7 != 3);
    }
LAB_001334d0:
    if (lVar8 == 0) {
      if (lVar9 != -1) {
        pMVar2 = (this->_buckets).
                 super__Vector_base<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>,_std::allocator<GF2::MP<137UL,_GF2::MOGrlex<137UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar5 = *(void **)&pMVar2[lVar9].
                            super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                            super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>;
        psVar1 = (size_t *)
                 ((long)&pMVar2[lVar9].super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>.
                         super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> + 0x10);
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pvVar5,0x28);
      }
      return lVar9 != -1;
    }
  } while( true );
}

Assistant:

bool PopLM(MM<_n>& lm)
		{
			int cmp;
			size_t i = SIZE_MAX, j = (size_t)_buckets.size();
			const _O& o = _buckets[0].GetOrder();
			do
			{
				// пропускаем пустые корзины
				if (_buckets[--j].IsEmpty())
					continue;
				// новый старший моном?
				if (i == SIZE_MAX || (cmp = o.Compare(_buckets[j].LM(), lm)) > 0)
					lm = _buckets[i = j].LM();
				// одинаковые мономы?
				else if (cmp == 0) 
				{
					// удаляем мономы из корзин и начинаем все сначала
					_buckets[i].PopLM(), _buckets[j].PopLM();
					i = SIZE_MAX, j = (size_t)_buckets.size();
				}
			}
			while (j != 0);
			// моногочлен ненулевой?
			if (i != SIZE_MAX) _buckets[i].PopLM();
			// признак успеха
			return i != SIZE_MAX;
		}